

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSR.cpp
# Opt level: O1

void __thiscall CSR::turntoCSR(CSR *this)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  double *pdVar4;
  void *__s;
  void *__s_00;
  void *__s_01;
  void *__s_02;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  ulong __n;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  
  lVar12 = (long)this->row;
  uVar13 = lVar12 * 4;
  if (lVar12 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  __s = operator_new__(uVar13);
  memset(__s,0,uVar13);
  uVar13 = lVar12 * 4 + 4;
  if (lVar12 < -1) {
    uVar13 = 0xffffffffffffffff;
  }
  __s_00 = operator_new__(uVar13);
  memset(__s_00,0,uVar13);
  lVar12 = (long)this->nonzero;
  uVar13 = lVar12 * 4;
  if (lVar12 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  __n = lVar12 * 8;
  if (lVar12 < 0) {
    __n = 0xffffffffffffffff;
  }
  __s_01 = operator_new__(uVar13);
  memset(__s_01,0,uVar13);
  __s_02 = operator_new__(__n);
  memset(__s_02,0,__n);
  lVar12 = std::chrono::_V2::system_clock::now();
  iVar2 = this->nonzero;
  if (0 < (long)iVar2) {
    piVar3 = this->idx;
    lVar7 = 0;
    do {
      piVar1 = (int *)((long)__s + (long)piVar3[lVar7] * 4);
      *piVar1 = *piVar1 + 1;
      lVar7 = lVar7 + 1;
    } while (iVar2 != lVar7);
  }
  lVar7 = (long)this->row;
  if (0 < lVar7) {
    lVar6 = 0;
    iVar9 = 0;
    do {
      *(int *)((long)__s_00 + lVar6 * 4) = iVar9;
      iVar9 = iVar9 + *(int *)((long)__s + lVar6 * 4);
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  *(int *)((long)__s_00 + lVar7 * 4) = iVar2;
  memset(__s,0,lVar7 << 2);
  iVar2 = this->col;
  if (0 < (long)iVar2) {
    pdVar4 = this->val;
    piVar3 = this->ptr;
    piVar1 = this->idx;
    lVar7 = 0;
    do {
      lVar10 = (long)piVar3[lVar7];
      lVar6 = lVar7 + 1;
      if (piVar3[lVar7] < piVar3[lVar7 + 1]) {
        do {
          lVar11 = (long)piVar1[lVar10];
          iVar9 = *(int *)((long)__s + lVar11 * 4);
          lVar8 = (long)*(int *)((long)__s_00 + lVar11 * 4) + (long)iVar9;
          *(int *)((long)__s_01 + lVar8 * 4) = (int)lVar7;
          *(double *)((long)__s_02 + lVar8 * 8) = pdVar4[lVar10];
          *(int *)((long)__s + lVar11 * 4) = iVar9 + 1;
          lVar10 = lVar10 + 1;
        } while (lVar10 < piVar3[lVar6]);
      }
      lVar7 = lVar6;
    } while (lVar6 != iVar2);
  }
  lVar7 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"execution time (turn to CSR2):",0x1e);
  poVar5 = std::ostream::_M_insert<double>((double)(lVar7 - lVar12) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  if (-1 < this->row) {
    piVar3 = this->ptr;
    lVar12 = -1;
    do {
      piVar3[lVar12 + 1] = *(int *)((long)__s_00 + lVar12 * 4 + 4);
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->row);
  }
  iVar2 = this->nonzero;
  if (0 < (long)iVar2) {
    pdVar4 = this->val;
    lVar12 = 0;
    do {
      pdVar4[lVar12] = *(double *)((long)__s_02 + lVar12 * 8);
      lVar12 = lVar12 + 1;
    } while (iVar2 != lVar12);
  }
  if (0 < this->nonzero) {
    piVar3 = this->idx;
    lVar12 = 0;
    do {
      piVar3[lVar12] = *(int *)((long)__s_01 + lVar12 * 4);
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->nonzero);
  }
  operator_delete__(__s);
  operator_delete__(__s_01);
  operator_delete__(__s_00);
  operator_delete__(__s_02);
  return;
}

Assistant:

void  CSR::turntoCSR()
{
    int *rowCnt= new int [row]();
    int *ptrR = new int[row+1]();
    int counter = 0;
    int *colIdx = new int[nonzero]();
    double *valR = new double [nonzero]();

    //
  //  int *idxR = new int[nonzero]();
  //
    std::chrono::time_point<std::chrono::system_clock> start, end;
    std::chrono::duration<double> elapsed_seconds;
    start = std::chrono::system_clock::now();
    for(int i=0; i<nonzero; i++)
    {
        rowCnt[idx[i]]++;
    }
    for(int i=0; i<row; i++)
    {
        ptrR[i] = counter;
        counter += rowCnt[i];
    }
    ptrR[row] = nonzero;
    memset(rowCnt, 0, sizeof(int) * row);//makes zero all elements of rowCtn
    for(int i=0; i<col; i++)
    {
        for(int j= ptr[i]; j<ptr[i+1]; j++)
        {
           int r = idx[j];
           int index = rowCnt[r]+ptrR[r];
           colIdx[index] = i;
           valR[index] = val[j];
           rowCnt[r]++;
        }
    }
    end = std::chrono::system_clock::now();
    elapsed_seconds = end - start;
    double durationSym1 = elapsed_seconds.count();
    cout << "execution time (turn to CSR2):" << durationSym1 << "\n";

    for(int i=0; i<row+1; i++)
    {
        ptr[i] = ptrR[i];
    }
    for(int i=0; i<nonzero; i++)
    {
        val[i] = valR[i];
    }
    for(int i=0; i<nonzero; i++)
    {
        idx[i] = colIdx[i];
    }

    delete []rowCnt;
    delete []colIdx;
    delete []ptrR;
    delete []valR;
}